

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void print_cycles<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ofstream>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               basic_ofstream<char,_std::char_traits<char>_> *os)

{
  bool bVar1;
  reference __val;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var2;
  undefined1 local_70 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_60;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cycle_start;
  basic_ofstream<char,_std::char_traits<char>_> *os_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  cycle_start._M_current = (int *)os;
  os_local = (basic_ofstream<char,_std::char_traits<char>_> *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &os_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_28 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&last_local,0);
    local_38._M_current = last_local._M_current;
    local_40._M_current = (int *)os_local;
    __val = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&local_28);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                         (local_38,local_40,__val);
    p_Var2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_30);
    local_50 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)p_Var2->_M_current;
    local_48._M_current = local_28._M_current;
    last_local._M_current = (int *)local_50;
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_60,(ostream_type *)cycle_start._M_current," ");
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_70,local_48,
               local_50);
    std::operator<<((ostream *)cycle_start._M_current,"\n");
  }
  return;
}

Assistant:

void print_cycles(ForwardIterator first, ForwardIterator last, OutputStream &os)
{
    using T = typename std::iterator_traits<ForwardIterator>::value_type;
    while (first != last)
    {
        auto const cycle_start = first++;
        first = ++find(first, last, *cycle_start);
        copy(cycle_start, first, std::ostream_iterator<T>(os, " "));
        os << "\n";
    }
}